

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xatlas.cpp
# Opt level: O0

void __thiscall
xatlas::internal::
HashMap<xatlas::internal::Mesh::EdgeKey,_xatlas::internal::Mesh::EdgeHash,_xatlas::internal::Equal<xatlas::internal::Mesh::EdgeKey>_>
::add(HashMap<xatlas::internal::Mesh::EdgeKey,_xatlas::internal::Mesh::EdgeHash,_xatlas::internal::Equal<xatlas::internal::Mesh::EdgeKey>_>
      *this,EdgeKey *key)

{
  uint32_t uVar1;
  uint32_t uVar2;
  uint32_t hash;
  EdgeKey *key_local;
  HashMap<xatlas::internal::Mesh::EdgeKey,_xatlas::internal::Mesh::EdgeHash,_xatlas::internal::Equal<xatlas::internal::Mesh::EdgeKey>_>
  *this_local;
  
  if (this->m_slots == (uint32_t *)0x0) {
    alloc(this);
  }
  uVar1 = computeHash(this,key);
  Array<xatlas::internal::Mesh::EdgeKey>::push_back(&this->m_keys,key);
  Array<unsigned_int>::push_back(&this->m_next,this->m_slots + uVar1);
  uVar2 = Array<unsigned_int>::size(&this->m_next);
  this->m_slots[uVar1] = uVar2 - 1;
  return;
}

Assistant:

void add(const Key &key)
	{
		if (!m_slots)
			alloc();
		const uint32_t hash = computeHash(key);
		m_keys.push_back(key);
		m_next.push_back(m_slots[hash]);
		m_slots[hash] = m_next.size() - 1;
	}